

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

void __thiscall BaseFSNode::Serialize(BaseFSNode *this,CJSON *json)

{
  allocator<char> local_31;
  string local_30;
  
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_30,"name",&local_31);
  CJSON::AddPair<std::__cxx11::string>(json,&local_30,&this->m_Name);
  std::__cxx11::string::~string((string *)&local_30);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_30,"path",&local_31);
  CJSON::AddPair<std::__cxx11::string>(json,&local_30,&this->m_Path);
  std::__cxx11::string::~string((string *)&local_30);
  return;
}

Assistant:

void Serialize(CJSON &json) const
        {
            json.AddPair("name", m_Name);
            json.AddPair("path", m_Path);
        }